

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void SetCursorPosYAndSetupDummyPrevLine(float pos_y,float line_height)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  uint uVar4;
  float fVar5;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->Accessed = true;
  fVar1 = (pIVar2->DC).CursorMaxPos.y;
  fVar5 = ((pIVar2->Pos).y - (pIVar2->Scroll).y) + pos_y;
  (pIVar2->DC).CursorPos.y = fVar5;
  uVar4 = -(uint)(fVar5 <= fVar1);
  (pIVar2->DC).CursorMaxPos.y = (float)(uVar4 & (uint)fVar1 | ~uVar4 & (uint)fVar5);
  (pIVar2->DC).CursorPosPrevLine.y = fVar5 - line_height;
  (pIVar2->DC).PrevLineHeight = line_height - (pIVar3->Style).ItemSpacing.y;
  if (1 < (pIVar2->DC).ColumnsCount) {
    (pIVar2->DC).ColumnsCellMinY = fVar5;
  }
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->Accessed = true; return g.CurrentWindow; }